

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void smlBufDumpEntityDecl(xmlBufPtr buf,xmlEntityPtr ent)

{
  int len;
  xmlBufferPtr buf_00;
  xmlChar *str;
  int use;
  xmlChar *content;
  xmlBufferPtr buffer;
  xmlEntityPtr ent_local;
  xmlBufPtr buf_local;
  
  buf_00 = xmlBufferCreate();
  if (buf_00 != (xmlBufferPtr)0x0) {
    xmlDumpEntityDecl(buf_00,ent);
    str = buf_00->content + 1;
    len = buf_00->use - 2;
    str[(int)(buf_00->use - 3)] = '\n';
    str[len] = '0';
    xmlBufAdd(buf,str,len);
    xmlBufferFree(buf_00);
  }
  return;
}

Assistant:

static void
smlBufDumpEntityDecl(xmlBufPtr buf, xmlEntityPtr ent) {
    xmlBufferPtr buffer;
    xmlChar *content;
    int use;

    buffer = xmlBufferCreate();
    if (buffer == NULL) {
        /*
         * TODO set the error in buf
         */
        return;
    }
    /* Quick and dirty conversion to SML: */
    /* Generate the XML version, then remove the head < an trailing > */
    xmlDumpEntityDecl(buffer, ent);
    content = buffer->content + 1; /* Skip the head < */
    use = (int)buffer->use - 2; /* Remove two characters: The < and > */
    content[use-1] = '\n'; /* Replace the > by a \n */
    content[use] = '0'; /* Overwrite the previous \n */
    xmlBufAdd(buf, content, use);
    xmlBufferFree(buffer);
}